

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O0

int parse_schema_nodeid(char *id,char **mod_name,int *mod_name_len,char **name,int *nam_len,
                       int *is_relative,int *has_predicate,int *all_desc,int extended)

{
  int iVar1;
  int local_44;
  int ret;
  int parsed;
  int *is_relative_local;
  int *nam_len_local;
  char **name_local;
  int *mod_name_len_local;
  char **mod_name_local;
  char *id_local;
  
  local_44 = 0;
  if (id == (char *)0x0) {
    __assert_fail("id",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                  ,0x3b7,
                  "int parse_schema_nodeid(const char *, const char **, int *, const char **, int *, int *, int *, int *, int)"
                 );
  }
  if (is_relative != (int *)0x0) {
    if (has_predicate != (int *)0x0) {
      *has_predicate = 0;
    }
    if (*id == '/') {
      if (*is_relative == -1) {
        *is_relative = 0;
      }
      local_44 = 1;
      mod_name_local = (char **)(id + 1);
    }
    else {
      if (*is_relative != -1) {
        return 0;
      }
      *is_relative = 1;
      iVar1 = strncmp(id,"./",2);
      mod_name_local = (char **)id;
      if (iVar1 == 0) {
        local_44 = 2;
        mod_name_local = (char **)(id + 2);
      }
    }
    iVar1 = parse_node_identifier
                      ((char *)mod_name_local,mod_name,mod_name_len,name,nam_len,all_desc,extended);
    if (iVar1 < 1) {
      id_local._4_4_ = iVar1 - local_44;
    }
    else {
      id_local._4_4_ = iVar1 + local_44;
      if ((*(char *)((long)mod_name_local + (long)iVar1) == '[') && (has_predicate != (int *)0x0)) {
        *has_predicate = 1;
      }
    }
    return id_local._4_4_;
  }
  __assert_fail("is_relative",
                "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                ,0x3b8,
                "int parse_schema_nodeid(const char *, const char **, int *, const char **, int *, int *, int *, int *, int)"
               );
}

Assistant:

int
parse_schema_nodeid(const char *id, const char **mod_name, int *mod_name_len, const char **name, int *nam_len,
                    int *is_relative, int *has_predicate, int *all_desc, int extended)
{
    int parsed = 0, ret;

    assert(id);
    assert(is_relative);

    if (has_predicate) {
        *has_predicate = 0;
    }

    if (id[0] != '/') {
        if (*is_relative != -1) {
            return -parsed;
        } else {
            *is_relative = 1;
        }
        if (!strncmp(id, "./", 2)) {
            parsed += 2;
            id += 2;
        }
    } else {
        if (*is_relative == -1) {
            *is_relative = 0;
        }
        ++parsed;
        ++id;
    }

    if ((ret = parse_node_identifier(id, mod_name, mod_name_len, name, nam_len, all_desc, extended)) < 1) {
        return -parsed + ret;
    }

    parsed += ret;
    id += ret;

    if ((id[0] == '[') && has_predicate) {
        *has_predicate = 1;
    }

    return parsed;
}